

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O3

void md5_write(BinarySink *bs,void *vp,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var4;
  byte bVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong __n;
  BinarySink *local_78;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Stack_70;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *local_68;
  BinarySink *pBStack_60;
  _func_void_BinarySink_ptr_void_ptr_size_t *local_58;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Stack_50;
  BinarySink *local_48;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Stack_40;
  
  if (len != 0) {
    do {
      __n = 0x40 - (long)bs[-1].writefmtv;
      if (len < __n) {
        __n = len;
      }
      memcpy(bs[-1].writefmtv + (long)&bs[-4].binarysink_,vp,__n);
      p_Var4 = bs[-1].writefmtv;
      bs[-1].writefmtv = p_Var4 + __n;
      bs[-1].binarysink_ = (BinarySink *)((long)&(bs[-1].binarysink_)->write + __n);
      if (p_Var4 + __n == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x40) {
        bs[-1].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
        local_48 = bs[-2].binarysink_;
        p_Stack_40 = bs[-1].write;
        local_58 = bs[-2].write;
        p_Stack_50 = bs[-2].writefmtv;
        local_68 = bs[-3].writefmtv;
        pBStack_60 = bs[-3].binarysink_;
        local_78 = bs[-4].binarysink_;
        p_Stack_70 = bs[-3].write;
        uVar1 = *(uint *)((long)&bs[-4].write + 4);
        uVar2 = *(uint *)&bs[-4].writefmtv;
        uVar3 = *(uint *)((long)&bs[-4].writefmtv + 4);
        lVar6 = 0x2c;
        uVar9 = *(uint *)&bs[-4].write;
        uVar10 = uVar1;
        uVar7 = uVar2;
        uVar8 = uVar3;
        do {
          uVar9 = ((uVar7 ^ uVar8) & uVar10 ^ uVar8) + uVar9 +
                  *(int *)("void md5_block_pad(md5_block *, BinarySink *)" + lVar6 + 3) +
                  *(int *)((long)&local_78 +
                          (ulong)*(uint *)("void md5_block_pad(md5_block *, BinarySink *)" +
                                          lVar6 + 0xb) * 4);
          uVar9 = (uVar9 << ("void md5_block_pad(md5_block *, BinarySink *)"[lVar6 + 7] & 0x1fU) |
                  uVar9 >> 0x20 - ("void md5_block_pad(md5_block *, BinarySink *)"[lVar6 + 7] &
                                  0x1fU)) + uVar10;
          uVar8 = uVar8 + *(int *)("void md5_block_pad(md5_block *, BinarySink *)" + lVar6 + 0xf) +
                  *(int *)((long)&local_78 +
                          (ulong)*(uint *)("void md5_block_pad(md5_block *, BinarySink *)" +
                                          lVar6 + 0x17) * 4) + ((uVar10 ^ uVar7) & uVar9 ^ uVar7);
          uVar8 = (uVar8 << ("void md5_block_pad(md5_block *, BinarySink *)"[lVar6 + 0x13] & 0x1fU)
                  | uVar8 >> 0x20 - ("void md5_block_pad(md5_block *, BinarySink *)"[lVar6 + 0x13] &
                                    0x1fU)) + uVar9;
          uVar7 = uVar7 + *(int *)("void md5_block_pad(md5_block *, BinarySink *)" + lVar6 + 0x1b) +
                  *(int *)((long)&local_78 +
                          (ulong)*(uint *)("void md5_block_pad(md5_block *, BinarySink *)" +
                                          lVar6 + 0x23) * 4) + ((uVar9 ^ uVar10) & uVar8 ^ uVar10);
          uVar7 = (uVar7 << ("void md5_block_pad(md5_block *, BinarySink *)"[lVar6 + 0x1f] & 0x1fU)
                  | uVar7 >> 0x20 - ("void md5_block_pad(md5_block *, BinarySink *)"[lVar6 + 0x1f] &
                                    0x1fU)) + uVar8;
          uVar10 = uVar10 + *(int *)("void md5_block_pad(md5_block *, BinarySink *)" + lVar6 + 0x27)
                   + *(int *)((long)&local_78 +
                             (ulong)*(uint *)((long)&md5_round_constants[0].addition + lVar6) * 4) +
                   ((uVar8 ^ uVar9) & uVar7 ^ uVar9);
          uVar10 = (uVar10 << ("void md5_block_pad(md5_block *, BinarySink *)"[lVar6 + 0x2b] & 0x1fU
                              ) |
                   uVar10 >> 0x20 - ("void md5_block_pad(md5_block *, BinarySink *)"[lVar6 + 0x2b] &
                                    0x1fU)) + uVar7;
          lVar6 = lVar6 + 0x30;
        } while (lVar6 != 0xec);
        lVar6 = 0;
        do {
          uVar9 = uVar9 + *(int *)((long)&md5_round_constants[0x10].addition + lVar6) +
                  ((uVar10 ^ uVar7) & uVar8 ^ uVar7) +
                  *(int *)((long)&local_78 +
                          (ulong)*(uint *)((long)&md5_round_constants[0x10].msg_index + lVar6) * 4);
          bVar5 = *(byte *)((long)&md5_round_constants[0x10].rotation + lVar6) & 0x1f;
          uVar9 = (uVar9 << bVar5 | uVar9 >> 0x20 - bVar5) + uVar10;
          uVar8 = uVar8 + *(int *)((long)&md5_round_constants[0x11].addition + lVar6) +
                  *(int *)((long)&local_78 +
                          (ulong)*(uint *)((long)&md5_round_constants[0x11].msg_index + lVar6) * 4)
                  + ((uVar9 ^ uVar10) & uVar7 ^ uVar10);
          bVar5 = *(byte *)((long)&md5_round_constants[0x11].rotation + lVar6) & 0x1f;
          uVar8 = (uVar8 << bVar5 | uVar8 >> 0x20 - bVar5) + uVar9;
          uVar7 = uVar7 + *(int *)((long)&md5_round_constants[0x12].addition + lVar6) +
                  *(int *)((long)&local_78 +
                          (ulong)*(uint *)((long)&md5_round_constants[0x12].msg_index + lVar6) * 4)
                  + ((uVar8 ^ uVar9) & uVar10 ^ uVar9);
          bVar5 = *(byte *)((long)&md5_round_constants[0x12].rotation + lVar6) & 0x1f;
          uVar7 = (uVar7 << bVar5 | uVar7 >> 0x20 - bVar5) + uVar8;
          uVar10 = uVar10 + *(int *)((long)&md5_round_constants[0x13].addition + lVar6) +
                   *(int *)((long)&local_78 +
                           (ulong)*(uint *)((long)&md5_round_constants[0x13].msg_index + lVar6) * 4)
                   + ((uVar7 ^ uVar8) & uVar9 ^ uVar8);
          bVar5 = *(byte *)((long)&md5_round_constants[0x13].rotation + lVar6) & 0x1f;
          uVar10 = (uVar10 << bVar5 | uVar10 >> 0x20 - bVar5) + uVar7;
          lVar6 = lVar6 + 0x30;
        } while (lVar6 != 0xc0);
        lVar6 = 0;
        do {
          uVar9 = (uVar10 ^ uVar7 ^ uVar8) + uVar9 +
                  *(int *)((long)&md5_round_constants[0x20].addition + lVar6) +
                  *(int *)((long)&local_78 +
                          (ulong)*(uint *)((long)&md5_round_constants[0x20].msg_index + lVar6) * 4);
          bVar5 = *(byte *)((long)&md5_round_constants[0x20].rotation + lVar6) & 0x1f;
          uVar9 = (uVar9 << bVar5 | uVar9 >> 0x20 - bVar5) + uVar10;
          uVar8 = uVar8 + *(int *)((long)&md5_round_constants[0x21].addition + lVar6) +
                  *(int *)((long)&local_78 +
                          (ulong)*(uint *)((long)&md5_round_constants[0x21].msg_index + lVar6) * 4)
                  + (uVar10 ^ uVar7 ^ uVar9);
          bVar5 = *(byte *)((long)&md5_round_constants[0x21].rotation + lVar6) & 0x1f;
          uVar8 = (uVar8 << bVar5 | uVar8 >> 0x20 - bVar5) + uVar9;
          uVar7 = uVar7 + *(int *)((long)&md5_round_constants[0x22].addition + lVar6) +
                  (uVar8 ^ uVar9 ^ uVar10) +
                  *(int *)((long)&local_78 +
                          (ulong)*(uint *)((long)&md5_round_constants[0x22].msg_index + lVar6) * 4);
          bVar5 = *(byte *)((long)&md5_round_constants[0x22].rotation + lVar6) & 0x1f;
          uVar7 = (uVar7 << bVar5 | uVar7 >> 0x20 - bVar5) + uVar8;
          uVar10 = uVar10 + *(int *)((long)&md5_round_constants[0x23].addition + lVar6) +
                   *(int *)((long)&local_78 +
                           (ulong)*(uint *)((long)&md5_round_constants[0x23].msg_index + lVar6) * 4)
                   + (uVar8 ^ uVar9 ^ uVar7);
          bVar5 = *(byte *)((long)&md5_round_constants[0x23].rotation + lVar6) & 0x1f;
          uVar10 = (uVar10 << bVar5 | uVar10 >> 0x20 - bVar5) + uVar7;
          lVar6 = lVar6 + 0x30;
        } while (lVar6 != 0xc0);
        lVar6 = 0;
        do {
          uVar9 = ((~uVar8 | uVar10) ^ uVar7) + uVar9 +
                  *(int *)((long)&md5_round_constants[0x30].addition + lVar6) +
                  *(int *)((long)&local_78 +
                          (ulong)*(uint *)((long)&md5_round_constants[0x30].msg_index + lVar6) * 4);
          bVar5 = *(byte *)((long)&md5_round_constants[0x30].rotation + lVar6) & 0x1f;
          uVar9 = (uVar9 << bVar5 | uVar9 >> 0x20 - bVar5) + uVar10;
          uVar8 = uVar8 + *(int *)((long)&md5_round_constants[0x31].addition + lVar6) +
                  *(int *)((long)&local_78 +
                          (ulong)*(uint *)((long)&md5_round_constants[0x31].msg_index + lVar6) * 4)
                  + ((~uVar7 | uVar9) ^ uVar10);
          bVar5 = *(byte *)((long)&md5_round_constants[0x31].rotation + lVar6) & 0x1f;
          uVar8 = (uVar8 << bVar5 | uVar8 >> 0x20 - bVar5) + uVar9;
          uVar7 = uVar7 + *(int *)((long)&md5_round_constants[0x32].addition + lVar6) +
                  *(int *)((long)&local_78 +
                          (ulong)*(uint *)((long)&md5_round_constants[0x32].msg_index + lVar6) * 4)
                  + ((~uVar10 | uVar8) ^ uVar9);
          bVar5 = *(byte *)((long)&md5_round_constants[0x32].rotation + lVar6) & 0x1f;
          uVar7 = (uVar7 << bVar5 | uVar7 >> 0x20 - bVar5) + uVar8;
          uVar10 = uVar10 + *(int *)((long)&md5_round_constants[0x33].addition + lVar6) +
                   *(int *)((long)&local_78 +
                           (ulong)*(uint *)((long)&md5_round_constants[0x33].msg_index + lVar6) * 4)
                   + ((~uVar9 | uVar7) ^ uVar8);
          bVar5 = *(byte *)((long)&md5_round_constants[0x33].rotation + lVar6) & 0x1f;
          uVar10 = (uVar10 << bVar5 | uVar10 >> 0x20 - bVar5) + uVar7;
          lVar6 = lVar6 + 0x30;
        } while (lVar6 != 0xc0);
        *(uint *)&bs[-4].write = uVar9 + *(uint *)&bs[-4].write;
        *(uint *)((long)&bs[-4].write + 4) = uVar10 + uVar1;
        *(uint *)&bs[-4].writefmtv = uVar7 + uVar2;
        *(uint *)((long)&bs[-4].writefmtv + 4) = uVar8 + uVar3;
        smemclr(&local_78,0x40);
      }
      vp = (void *)((long)vp + __n);
      len = len - __n;
    } while (len != 0);
  }
  return;
}

Assistant:

static void md5_write(BinarySink *bs, const void *vp, size_t len)
{
    md5 *s = BinarySink_DOWNCAST(bs, md5);

    while (len > 0)
        if (md5_block_write(&s->blk, &vp, &len))
            md5_do_block(s->core, s->blk.block);
}